

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O1

void com_get_nbr_c(pel *dst,int ipm_c,int ipm,int x,int y,int width,int height,pel *srcT,pel *srcL,
                  int s_src,u16 avail_cu,int scup,com_scu_t *map_scu,int i_scu,int bit_depth)

{
  pel *ppVar1;
  undefined2 uVar2;
  pel pVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  pel *ppVar8;
  ulong uVar9;
  size_t __n;
  int __c;
  pel *ppVar10;
  com_scu_t *pcVar11;
  int iVar12;
  int iVar13;
  s16 *pdst;
  
  __c = 1 << ((char)bit_depth - 1U & 0x1f);
  iVar6 = height;
  if (height < width) {
    iVar6 = width;
  }
  iVar6 = iVar6 * 2 + 4;
  if (ipm_c != 2) {
    if (ipm_c != 0 || ipm < 0x18) {
      ppVar10 = dst + 2;
      if ((avail_cu & 1) == 0) {
        memset(ppVar10,__c,(long)(iVar6 * 2));
      }
      else {
        uVar7 = width >> 1;
        __n = (size_t)(width * 2);
        memcpy(ppVar10,srcT,__n);
        ppVar10 = ppVar10 + __n;
        if ((int)uVar7 < 1) {
          iVar4 = 0;
        }
        else {
          lVar5 = 0;
          do {
            if (((byte)map_scu[lVar5 + (ulong)uVar7 + ((long)scup - (long)i_scu)] & 1) == 0) {
              uVar7 = (uint)lVar5;
              break;
            }
            *(undefined4 *)ppVar10 = *(undefined4 *)(srcT + lVar5 * 4 + __n);
            ppVar10 = ppVar10 + 4;
            lVar5 = lVar5 + 1;
          } while ((uint)lVar5 != uVar7);
          iVar4 = uVar7 * 2;
        }
        uVar7 = iVar6 - (iVar4 + width);
        if (0 < (int)uVar7) {
          uVar2 = *(undefined2 *)(ppVar10 + -2);
          uVar9 = 0;
          do {
            *(undefined2 *)(ppVar10 + uVar9 * 2) = uVar2;
            uVar9 = uVar9 + 1;
          } while (uVar9 < uVar7);
        }
      }
    }
    if (ipm_c == 3) goto LAB_00117ffe;
  }
  if (ipm_c != 0 || ipm - 0xdU < 0xfffffff6) {
    ppVar10 = dst + -2;
    if ((avail_cu & 2) == 0) {
      memset(ppVar10 + (2 - (long)(iVar6 * 2)),__c,(long)(iVar6 * 2));
    }
    else {
      iVar4 = height >> 1;
      lVar5 = (long)s_src;
      ppVar8 = srcL;
      if (0 < height) {
        iVar12 = 0;
        do {
          *(undefined2 *)ppVar10 = *(undefined2 *)ppVar8;
          ppVar1 = ppVar8 + lVar5;
          ppVar8 = ppVar8 + lVar5 * 2;
          *(undefined2 *)(ppVar10 + -2) = *(undefined2 *)ppVar1;
          ppVar10 = ppVar10 + -4;
          iVar12 = iVar12 + 2;
        } while (iVar12 < height);
      }
      if (iVar4 < 1) {
        iVar12 = 0;
      }
      else {
        pcVar11 = map_scu + (long)(iVar4 * i_scu) + (long)scup + -1;
        iVar13 = 0;
        do {
          iVar12 = iVar13;
          if (((byte)*pcVar11 & 1) == 0) break;
          *(undefined2 *)ppVar10 = *(undefined2 *)ppVar8;
          ppVar1 = ppVar8 + lVar5;
          ppVar8 = ppVar8 + lVar5 * 2;
          *(undefined2 *)(ppVar10 + -2) = *(undefined2 *)ppVar1;
          ppVar10 = ppVar10 + -4;
          iVar13 = iVar13 + 1;
          pcVar11 = pcVar11 + i_scu;
          iVar12 = iVar4;
        } while (iVar4 != iVar13);
        iVar12 = iVar12 * 2;
      }
      uVar7 = iVar6 - (iVar12 + height);
      if (0 < (int)uVar7) {
        uVar2 = *(undefined2 *)(ppVar10 + 2);
        uVar9 = 0;
        do {
          *(undefined2 *)(ppVar10 + uVar9 * 2 + (2 - (long)(int)(uVar7 * 2))) = uVar2;
          uVar9 = uVar9 + 1;
        } while (uVar9 < uVar7);
      }
    }
  }
LAB_00117ffe:
  if ((avail_cu & 4) == 0) {
    if ((avail_cu & 1) == 0) {
      if ((avail_cu & 2) == 0) {
        dst[1] = (pel)__c;
        *dst = (pel)__c;
        return;
      }
      *dst = *srcL;
      pVar3 = srcL[1];
    }
    else {
      *dst = *srcT;
      pVar3 = srcT[1];
    }
  }
  else {
    *dst = srcT[-2];
    pVar3 = srcT[-1];
  }
  dst[1] = pVar3;
  return;
}

Assistant:

void com_get_nbr_c(pel *dst, int ipm_c, int ipm, int x, int y, int width, int height, pel *srcT, pel *srcL, int s_src, u16 avail_cu, int scup, com_scu_t * map_scu, int i_scu, int bit_depth)
{
    int  i;
    int  width_in_scu = width >> (MIN_CU_LOG2 - 1);
    int  height_in_scu = height >> (MIN_CU_LOG2 - 1);
    pel *srcTL = srcT - 2;
    pel *up   = dst + 2;
    pel *left = dst - 2;

    int pad_le_in_scu = height_in_scu;
    int pad_up_in_scu = width_in_scu;

    int width2 = width << 1;
    int height2 = height << 1;
    int default_val = 1 << (bit_depth - 1);
    int pad_range = COM_MAX(width, height) * 2 + 4;

    if (ipm_c != IPD_HOR_C && (ipm_c != IPD_DM_C || ipm < IPD_HOR)) {
        if (IS_AVAIL(avail_cu, AVAIL_UP)) {
            com_scu_t *map_up_scu = map_scu + scup - i_scu + width_in_scu;

            memcpy(up, srcT, width2 * sizeof(pel));
            up += width2, srcT += width2;

            for (i = 0; i < pad_up_in_scu; i++, up += MIN_CU_SIZE, srcT += MIN_CU_SIZE) {
                if ((map_up_scu++)->coded) {
                    com_mcpy_4pel(up, srcT);
                } else {
                    break;
                }
            }
            const int shift = sizeof(pel) * 8;
            int uv_pixel = (up[-1] << shift) + up[-2];
            com_mset_2pel(up, uv_pixel, pad_range - (width + i * MIN_CU_SIZE / 2));
        } else {
            com_mset_pel(up, default_val, pad_range << 1);
        }
    }
    if (ipm_c != IPD_VER_C && (ipm_c != IPD_DM_C || ipm <= IPD_BI || ipm > IPD_VER)) {
        if (IS_AVAIL(avail_cu, AVAIL_LE)) {
            com_scu_t *map_left_scu = map_scu + scup - 1 + height_in_scu * i_scu;
            pel *src = srcL;

            for (i = 0; i < height; i+=2) {
                com_mcpy_2pel(left, src); src += s_src; left -= 2;
                com_mcpy_2pel(left, src); src += s_src; left -= 2;
            }
            for (i = 0; i < pad_le_in_scu; i++, map_left_scu += i_scu) {
                if (map_left_scu->coded) {
                    com_mcpy_2pel(left, src); src += s_src; left -= 2;
                    com_mcpy_2pel(left, src); src += s_src; left -= 2;
                } else {
                    break;
                }
            }

            const int shift = sizeof(pel) * 8;
            int uv_pixel = (left[3] << shift) + left[2];
            int pads = pad_range - height - i * MIN_CU_SIZE / 2;
            com_mset_2pel(left - pads * 2 + 2, uv_pixel, pads);
        } else {
            com_mset_pel(left - (pad_range << 1) + 2, default_val, pad_range << 1);
        }
    }
    if (IS_AVAIL(avail_cu, AVAIL_UL)) {
        dst[0] = srcTL[0];
        dst[1] = srcTL[1];
    } else if (IS_AVAIL(avail_cu, AVAIL_UP)) {
        dst[0] = srcTL[2];
        dst[1] = srcTL[3];
    } else if (IS_AVAIL(avail_cu, AVAIL_LE)) {
        dst[0] = srcL[0];
        dst[1] = srcL[1];
    } else {
        dst[0] = dst[1] = default_val;
    }
}